

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

IOTHUB_SYSTEM_PROPERTY_TYPE
GetMqttPropertyType(char *propertyNameAndValue,size_t propertyNameLength)

{
  int iVar1;
  size_t sVar2;
  ulong local_28;
  size_t index;
  IOTHUB_SYSTEM_PROPERTY_TYPE result;
  size_t propertyNameLength_local;
  char *propertyNameAndValue_local;
  
  local_28 = 0;
  while( true ) {
    if (0xd < local_28) {
      return IOTHUB_SYSTEM_PROPERTY_TYPE_APPLICATION_CUSTOM;
    }
    sVar2 = strlen(sysPropList[local_28].propName);
    if ((propertyNameLength == sVar2) &&
       (iVar1 = memcmp(propertyNameAndValue,sysPropList[local_28].propName,propertyNameLength),
       iVar1 == 0)) break;
    local_28 = local_28 + 1;
  }
  return sysPropList[local_28].propertyType;
}

Assistant:

static IOTHUB_SYSTEM_PROPERTY_TYPE GetMqttPropertyType(const char* propertyNameAndValue, size_t propertyNameLength)
{
    IOTHUB_SYSTEM_PROPERTY_TYPE result = IOTHUB_SYSTEM_PROPERTY_TYPE_APPLICATION_CUSTOM;
    size_t index = 0;

    for (index = 0; index < sysPropListLength; index++)
    {
        if (propertyNameLength == strlen(sysPropList[index].propName) &&
            memcmp(propertyNameAndValue, sysPropList[index].propName, propertyNameLength) == 0)
        {
            result = sysPropList[index].propertyType;
            break;
        }
    }

    return result;
}